

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int trytop(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  xmlNode *in_RDX;
  rnndb *in_RSI;
  rnndb *in_RDI;
  rnndb *unaff_retaddr;
  char *subfile;
  xmlAttr *attr;
  rnndb *in_stack_00000030;
  xmlAttr *attr_00;
  _xmlAttr *p_Var2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp((char *)in_RDX->name,"enum");
  if (iVar1 == 0) {
    parseenum((rnndb *)file,(char *)node,(xmlNode *)attr);
    iVar1 = 1;
  }
  else {
    iVar1 = strcmp((char *)in_RDX->name,"bitset");
    if (iVar1 == 0) {
      parsebitset((rnndb *)file,(char *)node,(xmlNode *)attr);
      iVar1 = 1;
    }
    else {
      iVar1 = strcmp((char *)in_RDX->name,"group");
      if (iVar1 == 0) {
        parsegroup(unaff_retaddr,
                   (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (xmlNode *)in_RDI);
        iVar1 = 1;
      }
      else {
        iVar1 = strcmp((char *)in_RDX->name,"domain");
        if (iVar1 == 0) {
          parsedomain(in_stack_00000030,(char *)db,(xmlNode *)file);
          iVar1 = 1;
        }
        else {
          iVar1 = strcmp((char *)in_RDX->name,"spectype");
          if (iVar1 == 0) {
            parsespectype(in_RDI,(char *)in_RSI,in_RDX);
            iVar1 = 1;
          }
          else {
            iVar1 = strcmp((char *)in_RDX->name,"import");
            if (iVar1 == 0) {
              attr_00 = (xmlAttr *)0x0;
              for (p_Var2 = in_RDX->properties; p_Var2 != (_xmlAttr *)0x0; p_Var2 = p_Var2->next) {
                iVar1 = strcmp((char *)p_Var2->name,"file");
                if (iVar1 == 0) {
                  attr_00 = (xmlAttr *)
                            getattrib(in_RSI,(char *)in_RDX,(int)((ulong)p_Var2 >> 0x20),attr_00);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",in_RSI,
                          (ulong)in_RDX->line,p_Var2->name);
                  in_RDI->estatus = 1;
                }
              }
              if (attr_00 == (xmlAttr *)0x0) {
                fprintf(_stderr,"%s:%d: missing \"file\" attribute for import\n",in_RSI,
                        (ulong)in_RDX->line);
                in_RDI->estatus = 1;
              }
              else {
                rnn_parsefile(in_RDI,(char *)in_RSI);
              }
              iVar1 = 1;
            }
            else {
              iVar1 = strcmp((char *)in_RDX->name,"copyright");
              if (iVar1 == 0) {
                parsecopyright((rnndb *)file,(char *)node,(xmlNode *)attr);
                iVar1 = 1;
              }
              else {
                iVar1 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}